

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndr.h
# Opt level: O0

int Ndr_ObjReadArray(Ndr_Data_t *p,int Obj,int Type,int **ppStart)

{
  int iVar1;
  int local_30;
  int local_2c;
  int Counter;
  int Ent;
  int **ppStart_local;
  int Type_local;
  int Obj_local;
  Ndr_Data_t *p_local;
  
  local_30 = 0;
  *ppStart = (int *)0x0;
  local_2c = Obj + 1;
  do {
    iVar1 = Ndr_DataEnd(p,Obj);
    if (iVar1 <= local_2c) {
      return local_30;
    }
    iVar1 = Ndr_DataType(p,local_2c);
    if (iVar1 == Type) {
      local_30 = local_30 + 1;
      if (*ppStart == (int *)0x0) {
        *ppStart = (int *)(p->pBody + local_2c);
      }
    }
    else if (*ppStart != (int *)0x0) {
      return local_30;
    }
    iVar1 = Ndr_DataSize(p,local_2c);
    local_2c = iVar1 + local_2c;
  } while( true );
}

Assistant:

static inline int Ndr_ObjReadArray( Ndr_Data_t * p, int Obj, int Type, int ** ppStart )
{
    int Ent, Counter = 0; *ppStart = NULL;
    Ndr_ObjForEachEntry( p, Obj, Ent )
        if ( Ndr_DataType(p, Ent) == Type )
        {
            Counter++;
            if ( *ppStart == NULL )
                *ppStart = (int *)p->pBody + Ent;
        }
        else if ( *ppStart )
            return Counter;
    return Counter;
}